

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po_test.cc
# Opt level: O1

void __thiscall unregistered_options::test_method(unregistered_options *this)

{
  char **argv;
  options_boost_po *this_00;
  int int_opt;
  int argc;
  option_group_definition arg_group;
  char command_line [31];
  int local_300;
  int local_2fc;
  undefined **local_2f8;
  ulong local_2f0;
  shared_count sStack_2e8;
  undefined4 **local_2e0;
  char **local_2d8;
  undefined4 local_2cc;
  undefined1 *local_2c8;
  long local_2c0;
  undefined1 local_2b8 [16];
  option_group_definition local_2a8;
  string local_270;
  undefined4 *local_250;
  int *local_248;
  undefined1 local_240;
  undefined8 local_238;
  shared_count sStack_230;
  undefined1 local_228 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210 [7];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_190;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  char *local_b8;
  char *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char local_78 [40];
  undefined **local_50;
  undefined1 local_48;
  undefined8 *local_40;
  char *local_38;
  
  builtin_strncpy(local_78,"exe --int_opt 3 --str_opt test",0x1f);
  argv = convert_to_command_args(local_78,&local_2fc,0x40);
  local_2d8 = argv;
  this_00 = (options_boost_po *)operator_new(0x2e8);
  VW::config::options_boost_po::options_boost_po(this_00,local_2fc,argv);
  local_2c8 = local_2b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"group1","");
  local_2a8.m_name._M_dataplus._M_p = (pointer)&local_2a8.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_2a8,local_2c8,local_2c8 + local_2c0);
  local_2a8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_2c8 != local_2b8) {
    operator_delete(local_2c8);
  }
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"int_opt","");
  VW::config::typed_option<int>::typed_option((typed_option<int> *)local_228,&local_270,&local_300);
  VW::config::option_group_definition::add<VW::config::typed_option<int>>
            (&local_2a8,(typed_option<int> *)local_228);
  local_228._0_8_ = &PTR__typed_option_003064d8;
  if (local_190._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_190._M_pi);
  }
  if (local_1a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  (**(this_00->super_options_i)._vptr_options_i)(this_00,&local_2a8);
  local_98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
  ;
  local_90 = "";
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_98,0x14f);
  local_2f8 = (undefined **)CONCAT71(local_2f8._1_7_,1);
  local_2f0 = 0;
  sStack_2e8.pi_ = (sp_counted_base *)0x0;
  local_228[8] = 0;
  local_228._0_8_ = &PTR__lazy_ostream_00306e90;
  local_228._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_210[0]._M_allocated_capacity = "no exceptions thrown by options->add_and_parse(arg_group)";
  local_b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
  ;
  local_b0 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2e8);
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
  ;
  local_f0 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f8,0x150);
  local_48 = 0;
  local_50 = &PTR__lazy_ostream_003066d8;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  local_250 = &local_2cc;
  local_240 = local_300 == 3;
  local_2cc = 3;
  local_238 = 0;
  sStack_230.pi_ = (sp_counted_base *)0x0;
  local_88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
  ;
  local_80 = "";
  local_210[0]._0_8_ = &local_248;
  local_248 = &local_300;
  local_228[8] = 0;
  local_228._0_8_ = &PTR__lazy_ostream_00306810;
  local_228._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = &local_250;
  local_2f0 = local_2f0 & 0xffffffffffffff00;
  local_2f8 = &PTR__lazy_ostream_00306810;
  sStack_2e8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_230);
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
  ;
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_118,0x152);
  (*(this_00->super_options_i)._vptr_options_i[7])(this_00);
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
  ;
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_138,0x152);
  local_2f8 = (undefined **)((ulong)local_2f8 & 0xffffffffffffff00);
  local_2f0 = 0;
  sStack_2e8.pi_ = (sp_counted_base *)0x0;
  local_228[8] = 0;
  local_228._0_8_ = &PTR__lazy_ostream_003071a8;
  local_228._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_210[0]._M_allocated_capacity = "exception VW::vw_exception expected but not raised";
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
  ;
  local_150 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2e8);
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_2a8.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.m_name._M_dataplus._M_p != &local_2a8.m_name.field_2) {
    operator_delete(local_2a8.m_name._M_dataplus._M_p);
  }
  (*(this_00->super_options_i)._vptr_options_i[9])(this_00);
  operator_delete(local_2d8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(unregistered_options) {
  int int_opt;

  char command_line[] = "exe --int_opt 3 --str_opt test";
  int argc;
  // Only the returned char* needs to be deleted as the individual pointers simply point into command_line.
  std::unique_ptr<char*> argv(convert_to_command_args(command_line, argc));

  std::unique_ptr<options_i> options = std::unique_ptr<options_boost_po>(
    new options_boost_po(argc, argv.get()));

  option_group_definition arg_group("group1");
  arg_group.add(make_option("int_opt", int_opt));

  BOOST_CHECK_NO_THROW(options->add_and_parse(arg_group));
  BOOST_CHECK_EQUAL(int_opt, 3);

  BOOST_CHECK_THROW(options->check_unregistered(), VW::vw_exception);
}